

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::cpp::UniqueName
                   (string *__return_storage_ptr__,string *name,string *filename,Options *options)

{
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  Options *local_28;
  Options *options_local;
  string *filename_local;
  string *name_local;
  
  local_28 = options;
  options_local = (Options *)filename;
  filename_local = name;
  name_local = __return_storage_ptr__;
  std::operator+(&local_48,name,"_");
  FilenameIdentifier(&local_68,&options_local->dllexport_decl);
  std::operator+(__return_storage_ptr__,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string UniqueName(const std::string& name, const std::string& filename,
                       const Options& options) {
  return name + "_" + FilenameIdentifier(filename);
}